

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::PrintTopologicalInfo
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,ostream *out)

{
  TPZSavable this_00;
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  TPZGeoNode *this_01;
  ostream *in_RSI;
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *this_02;
  int local_40;
  TPZSavable local_10;
  
  local_10._vptr_TPZSavable = (_func_int **)in_RSI;
  poVar3 = std::operator<<(in_RSI,"Geo Element - fId ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->fId);
  poVar3 = std::operator<<(poVar3,"\t Type ");
  this_02 = (TPZGeoBlend<pzgeom::TPZGeoLinear> *)&stack0xffffffffffffffd0;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TypeName_abi_cxx11_();
  poVar4 = std::operator<<(poVar3,(string *)this_02);
  std::operator<<(poVar4,"\t");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Print(this_02,poVar3);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (local_10._vptr_TPZSavable,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"\t");
  local_40 = 0;
  while( true ) {
    iVar2 = local_40;
    iVar1 = (**(code **)(*(long *)in_RDI + 0x90))();
    this_00._vptr_TPZSavable = local_10._vptr_TPZSavable;
    if (iVar1 <= iVar2) break;
    this_01 = TPZGeoEl::NodePtr(in_RDI,iVar2);
    iVar2 = TPZGeoNode::Id(this_01);
    poVar3 = (ostream *)std::ostream::operator<<(this_00._vptr_TPZSavable,iVar2);
    std::operator<<(poVar3," ");
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

virtual void PrintTopologicalInfo(std::ostream &out) override
	{
		out << "Geo Element - fId " << fId << "\t Type " << fGeo.TypeName() << "\t";
		fGeo.Print(out);
		int i;
		out << std::endl << "\t";
		for (i = 0;i < NNodes();i++) out << NodePtr(i)->Id() << " ";
	}